

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall Fl_Text_Display::calc_line_starts(Fl_Text_Display *this,int startLine,int endLine)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int startPos;
  long lVar4;
  long lVar5;
  int nextLineStart;
  int lineEnd;
  int local_38;
  int local_34;
  
  iVar1 = this->mNVisibleLines;
  if (endLine < 1) {
    endLine = 0;
  }
  if (iVar1 <= endLine) {
    endLine = iVar1 + -1;
  }
  iVar3 = 0;
  if (0 < startLine) {
    iVar3 = startLine;
  }
  if (iVar1 <= iVar3) {
    iVar3 = iVar1 + -1;
  }
  if (iVar3 <= endLine) {
    iVar1 = this->mBuffer->mLength;
    piVar2 = this->mLineStarts;
    if (iVar3 == 0) {
      *piVar2 = this->mFirstChar;
      iVar3 = 1;
    }
    lVar5 = (long)iVar3;
    if (piVar2[lVar5 + -1] == -1) {
      if (iVar3 <= endLine) goto LAB_001d1c8f;
    }
    else {
      if (iVar3 <= endLine) {
        iVar3 = endLine + 1;
        lVar4 = lVar5 << 0x20;
        startPos = piVar2[lVar5 + -1];
        do {
          find_line_end(this,startPos,true,&local_34,&local_38);
          if (iVar1 <= local_38) {
            iVar3 = (int)lVar5;
            if (lVar5 == 0) {
              lVar4 = 0;
            }
            else {
              if ((*(int *)((long)piVar2 + (lVar4 >> 0x1e) + -4) == iVar1) || (local_34 == local_38)
                 ) break;
              lVar4 = lVar4 >> 0x20;
            }
            piVar2[lVar4] = iVar1;
            iVar3 = iVar3 + 1;
            break;
          }
          piVar2[lVar5] = local_38;
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x100000000;
          startPos = local_38;
        } while (iVar3 != (int)lVar5);
      }
      if (iVar3 <= endLine) {
        lVar5 = (long)iVar3;
LAB_001d1c8f:
        memset(piVar2 + lVar5,0xff,(ulong)(uint)(endLine - iVar3) * 4 + 4);
        return;
      }
    }
  }
  return;
}

Assistant:

void Fl_Text_Display::calc_line_starts( int startLine, int endLine ) {
  int startPos, bufLen = mBuffer->length();
  int line, lineEnd, nextLineStart, nVis = mNVisibleLines;
  int *lineStarts = mLineStarts;

  /* Clean up (possibly) messy input parameters */
  if ( endLine < 0 ) endLine = 0;
  if ( endLine >= nVis ) endLine = nVis - 1;
  if ( startLine < 0 ) startLine = 0;
  if ( startLine >= nVis ) startLine = nVis - 1;
  if ( startLine > endLine )
    return;

  /* Find the last known good line number -> position mapping */
  if ( startLine == 0 ) {
    lineStarts[ 0 ] = mFirstChar;
    startLine = 1;
  }
  startPos = lineStarts[ startLine - 1 ];

  /* If the starting position is already past the end of the text,
   fill in -1's (means no text on line) and return */
  if ( startPos == -1 ) {
    for ( line = startLine; line <= endLine; line++ )
      lineStarts[ line ] = -1;
    return;
  }

  /* Loop searching for ends of lines and storing the positions of the
   start of the next line in lineStarts */
  for ( line = startLine; line <= endLine; line++ ) {
    find_line_end(startPos, true, &lineEnd, &nextLineStart);
    startPos = nextLineStart;
    if ( startPos >= bufLen ) {
      /* If the buffer ends with a newline or line break, put
       buf->length() in the next line start position (instead of
       a -1 which is the normal marker for an empty line) to
       indicate that the cursor may safely be displayed there */
      if ( line == 0 || ( lineStarts[ line - 1 ] != bufLen &&
                         lineEnd != nextLineStart ) ) {
        lineStarts[ line ] = bufLen;
        line++;
      }
      break;
    }
    lineStarts[ line ] = startPos;
  }

  /* Set any entries beyond the end of the text to -1 */
  for ( ; line <= endLine; line++ )
    lineStarts[ line ] = -1;
}